

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::OutputRowsORD
               (summarySampleslevelHeader *sh,int type,OASIS_FLOAT mean,OASIS_FLOAT stdDev,
               FILE *outFile,OASIS_FLOAT mean_impacted_exposure,OASIS_FLOAT max_impacted_exposure,
               OASIS_FLOAT chance_of_loss,OASIS_FLOAT max_loss)

{
  uint uVar1;
  uint uVar2;
  int strLen_00;
  mapped_type *pmVar3;
  char local_1038 [4];
  int strLen;
  char buffer [4096];
  OASIS_FLOAT max_loss_local;
  OASIS_FLOAT chance_of_loss_local;
  OASIS_FLOAT max_impacted_exposure_local;
  OASIS_FLOAT mean_impacted_exposure_local;
  FILE *outFile_local;
  OASIS_FLOAT stdDev_local;
  OASIS_FLOAT mean_local;
  int type_local;
  summarySampleslevelHeader *sh_local;
  
  if (outFile != (FILE *)0x0) {
    uVar1 = sh->event_id;
    uVar2 = sh->summary_id;
    buffer._4088_4_ = max_loss;
    buffer._4092_4_ = chance_of_loss;
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)event_rate_,&sh->event_id);
    strLen_00 = sprintf(local_1038,"%d,%d,%d,%f,%f,%f,%f,%f,%f,%f,%f\n",*pmVar3,
                        (double)(float)buffer._4092_4_,(double)mean,(double)stdDev,
                        (double)(float)buffer._4088_4_,(double)sh->expval,
                        (double)mean_impacted_exposure,(double)max_impacted_exposure,(ulong)uVar1,
                        (ulong)uVar2,(ulong)(uint)type);
    WriteOutput(local_1038,strLen_00,outFile);
  }
  return;
}

Assistant:

void OutputRowsORD(const summarySampleslevelHeader& sh, const int type,
			   const OASIS_FLOAT mean, const OASIS_FLOAT stdDev,
			   FILE * outFile,
			   const OASIS_FLOAT mean_impacted_exposure,
			   const OASIS_FLOAT max_impacted_exposure,
			   const OASIS_FLOAT chance_of_loss,
			   const OASIS_FLOAT max_loss)
	{

		if (outFile == nullptr) return;
		char buffer[4096];
		int strLen;
		strLen = sprintf(buffer, "%d,%d,%d,%f,%f,%f,%f,%f,%f,%f,%f\n",
				sh.event_id, sh.summary_id, type,
				event_rate_[sh.event_id], chance_of_loss, mean,
				stdDev, max_loss, sh.expval,
				mean_impacted_exposure, max_impacted_exposure);
		WriteOutput(buffer, strLen, outFile);

	}